

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TaggedUnionExpressionSyntax *pTVar1;
  Info *args_2;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  args_2 = TVar3.info;
  if (*(long *)(__fn + 0x38) != 0) {
    deepClone<slang::syntax::ExpressionSyntax>
              ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  }
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TaggedUnionExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*>
                     (this,(Token *)TVar2.info,TVar2._0_8_,(ExpressionSyntax **)args_2);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TaggedUnionExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TaggedUnionExpressionSyntax>(
        node.tagged.deepClone(alloc),
        node.member.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr
    );
}